

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

mraa_result_t mraa_gpio_chardev_edge_mode(mraa_gpio_context dev,mraa_gpio_edge_t mode)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  uint local_60;
  uint local_5c;
  int i;
  int k;
  gpioevent_request req;
  mraa_gpiod_group_t gpio_group;
  int status;
  mraa_gpio_edge_t mode_local;
  mraa_gpio_context dev_local;
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"gpio: edge_mode: context is invalid");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else if (plat->chardev_capable == 0) {
    syslog(3,"mraa_gpio_chardev_edge_mode() not supported for old sysfs interface");
    dev_local._4_4_ = MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
  }
  else {
    switch(mode) {
    case MRAA_GPIO_EDGE_NONE:
      return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    case MRAA_GPIO_EDGE_BOTH:
      req.lineoffset = 3;
      break;
    case MRAA_GPIO_EDGE_RISING:
      req.lineoffset = 1;
      break;
    case MRAA_GPIO_EDGE_FALLING:
      req.lineoffset = 2;
      break;
    default:
      return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    }
    local_5c = 0;
    while( true ) {
      bVar3 = false;
      if (local_5c < dev->num_chips) {
        req._40_8_ = dev->gpio_group + (int)local_5c;
        bVar3 = (_gpio_group *)req._40_8_ != (_gpio_group *)0x0;
      }
      if (!bVar3) break;
      if (dev->gpio_group[(int)local_5c].is_required != 0) {
        if (*(int *)(req._40_8_ + 8) != -1) {
          close(*(int *)(req._40_8_ + 8));
          *(undefined4 *)(req._40_8_ + 8) = 0xffffffff;
        }
        pvVar2 = malloc((ulong)*(uint *)(req._40_8_ + 0x10) << 2);
        *(void **)(req._40_8_ + 0x38) = pvVar2;
        if (*(long *)(req._40_8_ + 0x38) == 0) {
          syslog(3,"mraa_gpio_chardev_edge_mode(): malloc error!");
          return MRAA_ERROR_NO_RESOURCES;
        }
        for (local_60 = 0; local_60 < *(uint *)(req._40_8_ + 0x10); local_60 = local_60 + 1) {
          i = *(int *)(*(long *)(req._40_8_ + 0x18) + (long)(int)local_60 * 4);
          k = 1;
          iVar1 = _mraa_gpiod_ioctl(*(int *)(req._40_8_ + 4),0xc030b404,&i);
          if (iVar1 < 0) {
            syslog(3,"error getting line event handle for line %i",
                   (ulong)*(uint *)(*(long *)(req._40_8_ + 0x18) + (long)(int)local_60 * 4));
            return MRAA_ERROR_INVALID_RESOURCE;
          }
          *(undefined4 *)(*(long *)(req._40_8_ + 0x38) + (long)(int)local_60 * 4) =
               req.consumer_label._24_4_;
        }
      }
      local_5c = local_5c + 1;
    }
    dev_local._4_4_ = MRAA_SUCCESS;
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_gpio_chardev_edge_mode(mraa_gpio_context dev, mraa_gpio_edge_t mode)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "gpio: edge_mode: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (!plat->chardev_capable) {
        syslog(LOG_ERR, "mraa_gpio_chardev_edge_mode() not supported for old sysfs interface");
        return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    }

    int status;
    mraa_gpiod_group_t gpio_group;

    struct gpioevent_request req;

    switch (mode) {
        case MRAA_GPIO_EDGE_BOTH:
            req.eventflags = GPIOEVENT_REQUEST_BOTH_EDGES;
            break;
        case MRAA_GPIO_EDGE_RISING:
            req.eventflags = GPIOEVENT_REQUEST_RISING_EDGE;
            break;
        case MRAA_GPIO_EDGE_FALLING:
            req.eventflags = GPIOEVENT_REQUEST_FALLING_EDGE;
            break;
        /* Chardev interface doesn't handle EDGE_NONE. */
        case MRAA_GPIO_EDGE_NONE:
        default:
            return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    }

    for_each_gpio_group(gpio_group, dev)
    {
        if (gpio_group->gpiod_handle != -1) {
            close(gpio_group->gpiod_handle);
            gpio_group->gpiod_handle = -1;
        }

        gpio_group->event_handles = malloc(gpio_group->num_gpio_lines * sizeof(int));
        if (!gpio_group->event_handles) {
            syslog(LOG_ERR, "mraa_gpio_chardev_edge_mode(): malloc error!");
            return MRAA_ERROR_NO_RESOURCES;
        }

        for (int i = 0; i < gpio_group->num_gpio_lines; ++i) {
            req.lineoffset = gpio_group->gpio_lines[i];
            req.handleflags = GPIOHANDLE_REQUEST_INPUT;

            status = _mraa_gpiod_ioctl(gpio_group->dev_fd, GPIO_GET_LINEEVENT_IOCTL, &req);
            if (status < 0) {
                syslog(LOG_ERR, "error getting line event handle for line %i", gpio_group->gpio_lines[i]);
                return MRAA_ERROR_INVALID_RESOURCE;
            }

            gpio_group->event_handles[i] = req.fd;
        }
    }

    return MRAA_SUCCESS;
}